

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerBase.cpp
# Opt level: O0

shared_ptr<gui::Widget> __thiscall gui::ContainerBase::getChild(ContainerBase *this,size_t index)

{
  size_type sVar1;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Widget> sVar3;
  element_type *this_00;
  
  this_00 = in_RDI;
  sVar1 = std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
          ::size((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  *)(in_RSI + 8));
  if (in_RDX < sVar1) {
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
    operator[]((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)(in_RSI + 8),in_RDX);
    std::shared_ptr<gui::Widget>::shared_ptr
              ((shared_ptr<gui::Widget> *)this_00,(shared_ptr<gui::Widget> *)in_RDI);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<gui::Widget>::shared_ptr((shared_ptr<gui::Widget> *)this_00,in_RDI);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<gui::Widget>)sVar3.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Widget> ContainerBase::getChild(size_t index) const {
    if (index >= children_.size()) {
        return nullptr;
    }
    return children_[index];
}